

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall
slang::ast::Scope::handleNameConflict
          (Scope *this,Symbol *member,Symbol **existing,bool isElaborating)

{
  bool bVar1;
  SymbolIndex *pSVar2;
  byte in_CL;
  long *in_RDX;
  Symbol *in_RSI;
  Symbol *in_RDI;
  Scope *unaff_retaddr;
  uint32_t index;
  GenerateBlockSymbol *gen2;
  GenerateBlockSymbol *gen1;
  ForwardingTypedefSymbol *in_stack_ffffffffffffff68;
  GenericClassDefSymbol *in_stack_ffffffffffffff70;
  FormalArgumentSymbol *in_stack_ffffffffffffff78;
  Compilation *in_stack_ffffffffffffff80;
  VariableSymbol *in_stack_ffffffffffffffa0;
  FormalArgumentSymbol *in_stack_ffffffffffffffa8;
  Symbol *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  SymbolIndex local_38;
  SymbolIndex local_34;
  GenerateBlockSymbol *local_30;
  GenerateBlockSymbol *local_28;
  byte local_19;
  long *local_18;
  
  local_19 = in_CL & 1;
  if ((*(int *)*in_RDX == 0x23) && (in_RSI->kind == ForwardingTypedef)) {
    Symbol::as<slang::ast::TypeAliasType>((Symbol *)0x735021);
    Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x735033);
    TypeAliasType::addForwardDecl
              ((TypeAliasType *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if ((*(int *)*in_RDX == 0x16) && (in_RSI->kind == ForwardingTypedef)) {
    Symbol::as<slang::ast::ClassType>((Symbol *)0x735072);
    Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x735084);
    ClassType::addForwardDecl((ClassType *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if ((*(int *)*in_RDX == 0x43) && (in_RSI->kind == ForwardingTypedef)) {
    Symbol::as<slang::ast::GenericClassDefSymbol>((Symbol *)0x7350c3);
    Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x7350d5);
    GenericClassDefSymbol::addForwardDecl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    local_18 = in_RDX;
    if (*(int *)*in_RDX == 0x25) {
      if (in_RSI->kind == ForwardingTypedef) {
        Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x735118);
        Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x73512a);
        ForwardingTypedefSymbol::addForwardDecl
                  ((ForwardingTypedefSymbol *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        return;
      }
      if (in_RSI->kind == TypeAlias) {
        Symbol::as<slang::ast::TypeAliasType>((Symbol *)0x735156);
        Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x73516b);
        TypeAliasType::addForwardDecl
                  ((TypeAliasType *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        *local_18 = (long)in_RSI;
        return;
      }
      if (in_RSI->kind == ClassType) {
        Symbol::as<slang::ast::ClassType>((Symbol *)0x7351aa);
        Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x7351bf);
        ClassType::addForwardDecl((ClassType *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        *local_18 = (long)in_RSI;
        return;
      }
      if (in_RSI->kind == GenericClassDef) {
        Symbol::as<slang::ast::GenericClassDefSymbol>((Symbol *)0x7351fe);
        Symbol::as<slang::ast::ForwardingTypedefSymbol>((Symbol *)0x735213);
        GenericClassDefSymbol::addForwardDecl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        *local_18 = (long)in_RSI;
        return;
      }
    }
    if ((*(int *)*in_RDX == 0x33) && (in_RSI->kind == ExplicitImport)) {
      if (local_19 == 0) {
        Compilation::noteNameConflict(in_stack_ffffffffffffff80,(Symbol *)in_stack_ffffffffffffff78)
        ;
      }
      else {
        checkImportConflict((Scope *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_RDI,in_stack_ffffffffffffffb0);
      }
    }
    else {
      if ((*(int *)*in_RDX == 0x37) && (in_RSI->kind == GenerateBlock)) {
        local_28 = Symbol::as<slang::ast::GenerateBlockSymbol>((Symbol *)0x7352c4);
        local_30 = Symbol::as<slang::ast::GenerateBlockSymbol>((Symbol *)0x7352d6);
        if (local_28->constructIndex == local_30->constructIndex) {
          if ((local_28->isUninstantiated & 1U) == 0) {
            return;
          }
          *local_18 = (long)in_RSI;
          return;
        }
      }
      if ((((*(int *)*local_18 == 0x3d) || (*(int *)*local_18 == 0x3c)) &&
          ((in_RSI->kind == FormalArgument || (in_RSI->kind == Variable)))) &&
         (in_RSI->kind != *(SymbolKind *)*local_18)) {
        local_38 = Symbol::getIndex((Symbol *)*local_18);
        Symbol::getIndex(in_RSI);
        pSVar2 = std::min<unsigned_int>(&local_38,(uint *)&stack0xffffffffffffffc4);
        local_34 = *pSVar2;
        if (*(int *)*local_18 == 0x3d) {
          in_stack_ffffffffffffff78 =
               Symbol::as<slang::ast::FormalArgumentSymbol>((Symbol *)0x7353cf);
          Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x7353e1);
          bVar1 = FormalArgumentSymbol::mergeVariable
                            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          if (bVar1) {
            Symbol::setIndex((Symbol *)*local_18,local_34);
            return;
          }
        }
        else {
          Symbol::as<slang::ast::FormalArgumentSymbol>((Symbol *)0x73541c);
          Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x735431);
          bVar1 = FormalArgumentSymbol::mergeVariable
                            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          if (bVar1) {
            Symbol::setIndex((Symbol *)*local_18,local_34);
            *local_18 = (long)in_RSI;
            return;
          }
        }
      }
      if ((((local_19 & 1) == 0) && (bVar1 = Symbol::isValue((Symbol *)0x735488), bVar1)) &&
         (bVar1 = Symbol::isValue((Symbol *)0x73549b), bVar1)) {
        Compilation::noteNameConflict(in_stack_ffffffffffffff80,(Symbol *)in_stack_ffffffffffffff78)
        ;
      }
      else {
        reportNameConflict(unaff_retaddr,in_RDI,in_RSI);
      }
    }
  }
  return;
}

Assistant:

void Scope::handleNameConflict(const Symbol& member, const Symbol*& existing,
                               bool isElaborating) const {
    // We have a name collision; first check if this is ok (forwarding typedefs share a
    // name with the actual typedef) and if not give the user a helpful error message.
    if (existing->kind == SymbolKind::TypeAlias && member.kind == SymbolKind::ForwardingTypedef) {
        // Just add this forwarding typedef to a deferred list so we can process them
        // once we know the kind of symbol the alias points to.
        existing->as<TypeAliasType>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::ClassType && member.kind == SymbolKind::ForwardingTypedef) {
        // Class is already defined so nothing to do. When we elaborate the scope we will
        // check that the typedef had the correct 'class' specifier.
        existing->as<ClassType>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::GenericClassDef &&
        member.kind == SymbolKind::ForwardingTypedef) {
        // Class is already defined so nothing to do. When we elaborate the scope we will
        // check that the typedef had the correct 'class' specifier.
        existing->as<GenericClassDefSymbol>().addForwardDecl(member.as<ForwardingTypedefSymbol>());
        return;
    }

    if (existing->kind == SymbolKind::ForwardingTypedef) {
        if (member.kind == SymbolKind::ForwardingTypedef) {
            // Found another forwarding typedef; link it to the previous one.
            existing->as<ForwardingTypedefSymbol>().addForwardDecl(
                member.as<ForwardingTypedefSymbol>());
            return;
        }

        if (member.kind == SymbolKind::TypeAlias) {
            // We found the actual type for a previous forwarding declaration. Replace it in
            // the name map.
            member.as<TypeAliasType>().addForwardDecl(existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }

        if (member.kind == SymbolKind::ClassType) {
            member.as<ClassType>().addForwardDecl(existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }

        if (member.kind == SymbolKind::GenericClassDef) {
            member.as<GenericClassDefSymbol>().addForwardDecl(
                existing->as<ForwardingTypedefSymbol>());
            existing = &member;
            return;
        }
    }

    if (existing->kind == SymbolKind::ExplicitImport && member.kind == SymbolKind::ExplicitImport) {
        if (!isElaborating) {
            // These can't be checked until we can resolve the imports and
            // see if they point to the same symbol.
            compilation.noteNameConflict(member);
        }
        else {
            checkImportConflict(member, *existing);
        }
        return;
    }

    if (existing->kind == SymbolKind::GenerateBlock && member.kind == SymbolKind::GenerateBlock) {
        // If both are generate blocks and both are from the same generate construct, it's ok
        // for them to have the same name. We take the one that is instantiated.
        auto& gen1 = existing->as<GenerateBlockSymbol>();
        auto& gen2 = member.as<GenerateBlockSymbol>();
        if (gen1.constructIndex == gen2.constructIndex) {
            SLANG_ASSERT(gen1.isUninstantiated || gen2.isUninstantiated);
            if (gen1.isUninstantiated)
                existing = &member;
            return;
        }
    }

    // A formal argument (port) and its associated variable declaration get merged into one.
    // This is a pretty gross "feature" but oh well.
    if ((existing->kind == SymbolKind::FormalArgument || existing->kind == SymbolKind::Variable) &&
        (member.kind == SymbolKind::FormalArgument || member.kind == SymbolKind::Variable) &&
        member.kind != existing->kind) {

        // The lookup index should be whichever symbol is earlier.
        uint32_t index = std::min(uint32_t(existing->getIndex()), uint32_t(member.getIndex()));

        if (existing->kind == SymbolKind::FormalArgument) {
            if (const_cast<FormalArgumentSymbol&>(existing->as<FormalArgumentSymbol>())
                    .mergeVariable(member.as<VariableSymbol>())) {
                const_cast<Symbol*>(existing)->setIndex(SymbolIndex(index));
                return;
            }
        }
        else {
            if (const_cast<FormalArgumentSymbol&>(member.as<FormalArgumentSymbol>())
                    .mergeVariable(existing->as<VariableSymbol>())) {
                const_cast<Symbol*>(existing)->setIndex(SymbolIndex(index));
                existing = &member;
                return;
            }
        }
    }

    if (!isElaborating && existing->isValue() && member.isValue()) {
        // We want to look at the symbol types here to provide nicer error messages, but
        // it might not be safe to resolve the type at this point (because we're in the
        // middle of elaborating the scope). Save the member for later reporting.
        compilation.noteNameConflict(member);
        return;
    }

    reportNameConflict(member, *existing);
}